

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset_s.c
# Opt level: O2

int main(void)

{
  long lVar1;
  char s [10];
  undefined1 auStack_6 [6];
  
  set_constraint_handler_s(test_handler);
  for (lVar1 = -10; lVar1 != 0; lVar1 = lVar1 + 1) {
    auStack_6[lVar1] = 0x6f;
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
         ,0x3d,"s[9] == \'o\'");
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
         ,0x3f,"s[0] == \'o\'");
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
         ,0x42,"s[1] == \'o\'");
  if (HANDLER_CALLS != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x44,"HANDLER_CALLS == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( memset_s( s, 10, 'o', 10 ) == 0 );
    TESTCASE( s[9] == 'o' );
    TESTCASE( memset_s( s, 10, '_', ( 0 ) ) == 0 );
    TESTCASE( s[0] == 'o' );
    TESTCASE( memset_s( s, 10, '_', 1 ) == 0 );
    TESTCASE( s[0] == '_' );
    TESTCASE( s[1] == 'o' );

    TESTCASE( HANDLER_CALLS == 0 );
#endif
    return TEST_RESULTS;
}